

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuAsyncArray.H
# Opt level: O0

void __thiscall
amrex::Gpu::AsyncArray<double,_0>::AsyncArray(AsyncArray<double,_0> *this,double *h_p,size_t n)

{
  int iVar1;
  Arena *pAVar2;
  undefined4 extraout_var;
  long in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  if (in_RDX != 0) {
    pAVar2 = The_Pinned_Arena();
    iVar1 = (*pAVar2->_vptr_Arena[2])(pAVar2,in_RDX << 3);
    in_RDI[1] = CONCAT44(extraout_var,iVar1);
    memcpy((void *)in_RDI[1],in_RSI,in_RDX << 3);
  }
  return;
}

Assistant:

AsyncArray (T const* h_p, const std::size_t n)
    {
        if (n == 0) return;
        h_data = static_cast<T*>(The_Pinned_Arena()->alloc(n*sizeof(T)));
        std::memcpy(h_data, h_p, n*sizeof(T));
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            d_data = static_cast<T*>(The_Arena()->alloc(n*sizeof(T)));
            Gpu::htod_memcpy_async(d_data, h_data, n*sizeof(T));
        }
#endif
    }